

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_DecComputeFlipInvGain(Sfm_Dec_t *p,Abc_Obj_t *pPivot,int *pfNeedInv)

{
  Abc_Obj_t *pNode;
  Mio_Gate_t *pGate;
  int iVar1;
  int iGate;
  int iFanin;
  Mio_Gate_t *pGate_00;
  long lVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  lVar2 = 0;
  iVar3 = 0;
  iVar4 = 0;
  do {
    if ((pPivot->vFanouts).nSize <= lVar2) {
      if (iVar3 != 0) {
        iVar4 = iVar4 - p->AreaInv;
      }
      if (pfNeedInv != (int *)0x0) {
        *pfNeedInv = iVar3;
      }
      return iVar4;
    }
    pNode = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanouts).pArray[lVar2]];
    if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
      pGate = (Mio_Gate_t *)(pNode->field_5).pData;
      if ((pNode->vFanins).nSize == 1) {
        iVar1 = Mio_GateIsInv(pGate);
        if (iVar1 != 0) {
          iVar4 = iVar4 + p->AreaInv;
          goto LAB_0044409f;
        }
      }
      iGate = Mio_GateReadValue(pGate);
      iVar1 = (pNode->vFanins).nSize;
      iFanin = Abc_NodeFindFanin(pNode,pPivot);
      iVar1 = Sfm_LibFindComplInputGate(&p->vGateFuncs,iGate,iVar1,iFanin,(int *)0x0);
      if (iVar1 == -1) {
        iVar3 = 1;
      }
      else {
        pGate_00 = (Mio_Gate_t *)Vec_PtrEntry(&p->vGateHands,iVar1);
        dVar5 = Mio_GateReadArea(pGate);
        dVar6 = Mio_GateReadArea(pGate_00);
        iVar4 = (iVar4 + (int)((float)dVar5 * 1000.0)) - (int)((float)dVar6 * 1000.0);
      }
    }
    else {
      iVar3 = 1;
    }
LAB_0044409f:
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int Sfm_DecComputeFlipInvGain( Sfm_Dec_t * p, Abc_Obj_t * pPivot, int * pfNeedInv )
{
    Abc_Obj_t * pFanout; 
    Mio_Gate_t * pGate, * pGateNew;
    int i, Handle, fNeedInv = 0, Gain = 0;
    Abc_ObjForEachFanout( pPivot, pFanout, i )
    {
        if ( !Abc_ObjIsNode(pFanout) )
        {
            fNeedInv = 1;
            continue;
        }
        pGate = (Mio_Gate_t*)pFanout->pData;
        if ( Abc_ObjFaninNum(pFanout) == 1 && Mio_GateIsInv(pGate) )
        {
            Gain += p->AreaInv;
            continue;
        }
        Handle = Sfm_LibFindComplInputGate( &p->vGateFuncs, Mio_GateReadValue(pGate), Abc_ObjFaninNum(pFanout), Abc_NodeFindFanin(pFanout, pPivot), NULL );
        if ( Handle == -1 )
        {
            fNeedInv = 1;
            continue;
        }
        pGateNew = (Mio_Gate_t *)Vec_PtrEntry( &p->vGateHands, Handle );
        Gain += Scl_Flt2Int(Mio_GateReadArea(pGate)) - Scl_Flt2Int(Mio_GateReadArea(pGateNew));
    }
    if ( fNeedInv )
        Gain -= p->AreaInv;
    if ( pfNeedInv )
        *pfNeedInv = fNeedInv;
    return Gain;
}